

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsio.c
# Opt level: O3

void * wsio_clone_option(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  OPTIONHANDLER_HANDLE pOVar3;
  char *pcVar4;
  
  if (name == (char *)0x0 || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar4 = "invalid argument detected: const char* name=%p, const void* value=%p";
    iVar1 = 0x2ce;
  }
  else {
    iVar1 = strcmp(name,"WSIOOptions");
    if (iVar1 == 0) {
      pOVar3 = OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
      return pOVar3;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (void *)0x0;
    }
    pcVar4 = "unknown option: %s";
    iVar1 = 0x2db;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/wsio.c"
            ,"wsio_clone_option",iVar1,1,pcVar4,name);
  return (void *)0x0;
}

Assistant:

static void* wsio_clone_option(const char* name, const void* value)
{
    void *result;

    if (
        (name == NULL) ||
        (value == NULL)
        )
    {
        /* Codes_SRS_WSIO_01_174: [ If wsio_clone_option is called with NULL name or value it shall return NULL. ]*/
        LogError("invalid argument detected: const char* name=%p, const void* value=%p", name, value);
        result = NULL;
    }
    else
    {
        if (strcmp(name, WSIO_OPTIONS) == 0)
        {
            /* Codes_SRS_WSIO_01_171: [** wsio_clone_option called with name being WSIOOptions shall return the same value. ]*/
            result = (void*)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
        }
        else
        {
            /* Codes_SRS_WSIO_01_173: [ wsio_clone_option called with any other option name than WSIOOptions shall return NULL. ]*/
            LogError("unknown option: %s", name);
            result = NULL;
        }
    }

    return result;
}